

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall
jsonnet::internal::LiteralNumber::LiteralNumber
          (LiteralNumber *this,LocationRange *lr,Fodder *open_fodder,string *str)

{
  pointer pcVar1;
  double dVar2;
  
  AST::AST(&this->super_AST,lr,AST_LITERAL_NUMBER,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralNumber_00237000;
  dVar2 = strtod((str->_M_dataplus)._M_p,(char **)0x0);
  this->value = dVar2;
  (this->originalString)._M_dataplus._M_p = (pointer)&(this->originalString).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->originalString,pcVar1,pcVar1 + str->_M_string_length);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }